

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O2

void ncnn::draw_text_c1(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uchar *resized_font_bitmap;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  int iVar11;
  uchar *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  uVar13 = (ulong)(uint)x;
  iVar4 = fontpixelsize * 2;
  resized_font_bitmap = (uchar *)operator_new__((ulong)(uint)(iVar4 * fontpixelsize));
  sVar6 = strlen(text);
  uVar10 = 0;
  uVar8 = sVar6 & 0xffffffff;
  if ((int)sVar6 < 1) {
    uVar8 = uVar10;
  }
  for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
    cVar1 = text[uVar10];
    iVar11 = (int)uVar13;
    if (cVar1 == ' ') {
      uVar13 = (ulong)(uint)(iVar11 + fontpixelsize);
    }
    else if (cVar1 == '\n') {
      y = y + iVar4;
      uVar13 = (ulong)(uint)x;
    }
    else {
      iVar5 = isprint((int)cVar1);
      if (iVar5 != 0) {
        resize_bilinear_font
                  ((uchar *)((long)cVar1 * 400 + 0x5394a0),resized_font_bitmap,fontpixelsize);
        uVar14 = 0;
        if (0 < y) {
          uVar14 = (ulong)(uint)y;
        }
        iVar5 = iVar4 + y;
        if (h <= iVar4 + y) {
          iVar5 = h;
        }
        uVar15 = 0;
        if (0 < iVar11) {
          uVar15 = uVar13;
        }
        uVar7 = fontpixelsize + iVar11;
        uVar3 = w;
        if ((int)uVar7 < w) {
          uVar3 = uVar7;
        }
        puVar12 = pixels + (long)stride * uVar14;
        for (; (long)uVar14 < (long)iVar5; uVar14 = uVar14 + 1) {
          pbVar9 = resized_font_bitmap +
                   (uVar14 - (long)y) * (long)fontpixelsize + (uVar15 - (long)iVar11);
          for (uVar13 = uVar15; (int)uVar13 < (int)uVar3; uVar13 = uVar13 + 1) {
            bVar2 = *pbVar9;
            pbVar9 = pbVar9 + 1;
            puVar12[uVar13] =
                 (uchar)((ulong)((bVar2 ^ 0xff) * (uint)puVar12[uVar13] +
                                (color & 0xff) * (uint)bVar2) / 0xff);
          }
          puVar12 = puVar12 + stride;
        }
        uVar13 = (ulong)uVar7;
      }
    }
  }
  operator_delete__(resized_font_bitmap);
  return;
}

Assistant:

void draw_text_c1(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p += 1;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}